

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_math.c
# Opt level: O3

void p2sc_idct(double *n,double *m,int N)

{
  void *__src;
  ulong uVar1;
  ulong uVar2;
  double *pdVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  size_t __n;
  double dVar7;
  
  mxm(n,m,N,N,N,n);
  __n = (ulong)(uint)(N * N) << 3;
  __src = (void *)g_malloc(__n);
  if (0 < N) {
    uVar1 = (ulong)(uint)N;
    uVar2 = 0;
    do {
      uVar4 = 0;
      pdVar3 = n;
      do {
        dVar7 = 0.0;
        lVar5 = 0;
        uVar6 = uVar1;
        do {
          dVar7 = dVar7 + *(double *)((long)m + lVar5) * *(double *)((long)pdVar3 + lVar5);
          lVar5 = lVar5 + uVar1 * 8;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
        *(double *)((long)__src + uVar4 * 8 + uVar2 * uVar1 * 8) = dVar7;
        uVar4 = uVar4 + 1;
        pdVar3 = pdVar3 + 1;
      } while (uVar4 != uVar1);
      uVar2 = uVar2 + 1;
      m = m + 1;
    } while (uVar2 != uVar1);
  }
  memcpy(n,__src,__n);
  g_free(__src);
  return;
}

Assistant:

void p2sc_idct(double *n, double *m, int N) {
    mxm(n, m, N, N, N, n);
    mtxm(m, n, N, N, N, n);
}